

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::LazilyBuildDependenciesTest_Enum_Test::
~LazilyBuildDependenciesTest_Enum_Test(LazilyBuildDependenciesTest_Enum_Test *this)

{
  LazilyBuildDependenciesTest_Enum_Test *this_local;
  
  ~LazilyBuildDependenciesTest_Enum_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(LazilyBuildDependenciesTest, Enum) {
  ParseProtoAndAddToDb(
      R"pb(
        name: 'foo.proto'
        package: 'proto2_unittest'
        dependency: 'enum1.proto'
        dependency: 'enum2.proto'
        message_type {
          name: 'Lazy'
          field {
            name: 'enum1'
            number: 1
            label: LABEL_OPTIONAL
            type: TYPE_ENUM
            type_name: '.proto2_unittest.Enum1'
          }
          field {
            name: 'enum2'
            number: 1
            label: LABEL_OPTIONAL
            type: TYPE_ENUM
            type_name: '.proto2_unittest.Enum2'
          }
        })pb");
  AddSimpleEnumProtoFileToDb("enum1", "Enum1", "ENUM1");
  AddSimpleEnumProtoFileToDb("enum2", "Enum2", "ENUM2");

  const FileDescriptor* file = pool_.FindFileByName("foo.proto");

  // Verify calling enum_type() on a field whose definition is not
  // yet built will build the file and return a descriptor.
  EXPECT_FALSE(pool_.InternalIsFileLoaded("enum1.proto"));
  const Descriptor* desc = file->FindMessageTypeByName("Lazy");
  EXPECT_TRUE(desc != nullptr);
  const FieldDescriptor* field = desc->FindFieldByName("enum1");
  EXPECT_TRUE(field != nullptr);
  EXPECT_TRUE(field->enum_type() != nullptr);
  EXPECT_TRUE(pool_.InternalIsFileLoaded("enum1.proto"));

  // Verify calling default_value_enum() on a field whose definition is not
  // yet built will build the file and return a descriptor to the value.
  EXPECT_FALSE(pool_.InternalIsFileLoaded("enum2.proto"));
  field = desc->FindFieldByName("enum2");
  EXPECT_TRUE(field != nullptr);
  EXPECT_TRUE(field->default_value_enum() != nullptr);
  EXPECT_TRUE(pool_.InternalIsFileLoaded("enum2.proto"));
}